

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O0

feed_db_status_t end_transaction_db(feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char *local_20;
  char *err_msg;
  feed_db_t *db_local;
  
  err_msg = (char *)db;
  if (db->in_transaction == 0) {
    pcVar2 = strdup("cgtfs has not opened an unfinished transaction");
    *(char **)(err_msg + 0x10) = pcVar2;
    db_local._4_4_ = FEED_DB_ERROR;
  }
  else {
    local_20 = (char *)0x0;
    iVar1 = sqlite3_exec(db->conn,"END TRANSACTION;",(sqlite3_callback)0x0,(void *)0x0,&local_20);
    *(int *)(err_msg + 0x18) = iVar1;
    if (*(int *)(err_msg + 0x18) == 0) {
      err_msg[0x20] = '\0';
      err_msg[0x21] = '\0';
      err_msg[0x22] = '\0';
      err_msg[0x23] = '\0';
      db_local._4_4_ = FEED_DB_SUCCESS;
    }
    else {
      pcVar2 = strdup(local_20);
      *(char **)(err_msg + 0x10) = pcVar2;
      sqlite3_free(local_20);
      db_local._4_4_ = FEED_DB_ERROR;
    }
  }
  return db_local._4_4_;
}

Assistant:

feed_db_status_t end_transaction_db(feed_db_t *db) {

    if (db->in_transaction == 0) {
        db->error_msg = strdup("cgtfs has not opened an unfinished transaction");
        return FEED_DB_ERROR;
    }

    char *err_msg = 0;
    db->rc = sqlite3_exec(db->conn, "END TRANSACTION;", NULL, NULL, &err_msg);

    if (db->rc != SQLITE_OK) {
        db->error_msg = strdup(err_msg);
        sqlite3_free(err_msg);
        return FEED_DB_ERROR;
    }

    db->in_transaction = 0;

    return FEED_DB_SUCCESS;
}